

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewCNF.hpp
# Opt level: O0

bool __thiscall Shell::NewCNF::Occurrences::Iterator::hasNext(Iterator *this)

{
  bool bVar1;
  GenClause *this_00;
  SmartPtr<Shell::NewCNF::GenClause> *this_01;
  SmartPtr<Shell::NewCNF::Occurrence> *in_RDI;
  Occurrence occ;
  DelIterator *in_stack_ffffffffffffff78;
  DelIterator *this_02;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 uVar2;
  undefined1 in_stack_ffffffffffffffb7;
  Occurrence *in_stack_ffffffffffffffb8;
  SmartPtr<Shell::NewCNF::Occurrence> *in_stack_ffffffffffffffc0;
  int local_38;
  DelIterator local_28;
  byte local_1;
  
  do {
    bVar1 = Lib::List<Shell::NewCNF::Occurrence>::DelIterator::hasNext(in_stack_ffffffffffffff78);
    if (!bVar1) {
      local_1 = 0;
      break;
    }
    this_02 = &local_28;
    Lib::List<Shell::NewCNF::Occurrence>::DelIterator::next(this_02);
    this_00 = Lib::SmartPtr<Shell::NewCNF::GenClause>::operator->
                        ((SmartPtr<Shell::NewCNF::GenClause> *)this_02);
    if ((this_00->valid & 1U) == 0) {
      Lib::List<Shell::NewCNF::Occurrence>::DelIterator::del((DelIterator *)this_00);
      local_38 = 2;
    }
    else {
      this_01 = (SmartPtr<Shell::NewCNF::GenClause> *)Occurrence::operator_new(0xbe15ee);
      Lib::SmartPtr<Shell::NewCNF::GenClause>::SmartPtr
                ((SmartPtr<Shell::NewCNF::GenClause> *)&stack0xffffffffffffffa8,
                 (SmartPtr<Shell::NewCNF::GenClause> *)&local_28);
      Occurrence::Occurrence
                ((Occurrence *)this_00,(SPGenClause *)this_02,(uint)((ulong)this_01 >> 0x20));
      uVar2 = 0;
      Lib::SmartPtr<Shell::NewCNF::Occurrence>::SmartPtr
                (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,(bool)in_stack_ffffffffffffffb7
                );
      Lib::SmartPtr<Shell::NewCNF::Occurrence>::operator=
                ((SmartPtr<Shell::NewCNF::Occurrence> *)CONCAT17(uVar2,in_stack_ffffffffffffffa0),
                 in_RDI);
      Lib::SmartPtr<Shell::NewCNF::Occurrence>::~SmartPtr
                ((SmartPtr<Shell::NewCNF::Occurrence> *)this_01);
      Lib::SmartPtr<Shell::NewCNF::GenClause>::~SmartPtr(this_01);
      local_1 = 1;
      local_38 = 1;
    }
    Occurrence::~Occurrence((Occurrence *)0xbe16d9);
  } while (local_38 != 1);
  return (bool)(local_1 & 1);
}

Assistant:

inline bool hasNext() {
        while (_iterator.hasNext()) {
          Occurrence occ = _iterator.next();
          if (!occ.gc->valid) {
            _iterator.del();
            continue;
          }
          _current = SmartPtr<Occurrence>(new Occurrence(occ.gc, occ.position));
          return true;
        }
        return false;
      }